

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture_type.cpp
# Opt level: O2

ostream * operator<<(ostream *p_os,TextureType p_texture_type)

{
  ostream *poVar1;
  
  if (p_texture_type - SPECULAR < 4) {
    std::operator<<(p_os,&DAT_0057e3ec +
                         *(int *)(&DAT_0057e3ec + (ulong)(p_texture_type - SPECULAR) * 4));
    return p_os;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"unhandled switch case ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x1e);
  poVar1 = std::operator<<(poVar1,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/src/enums/texture_type.cpp"
                          );
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(1);
}

Assistant:

std::ostream &operator<<(std::ostream &p_os, const TextureType p_texture_type)
{
    switch (p_texture_type)
    {
    case TextureType::DIFFUSE:
    {
        p_os << "TextureType::DIFFUSE";
        break;
    };
    case TextureType::HEIGHT:
    {
        p_os << "TextureType::HEIGHT";
        break;
    };
    case TextureType::NORMAL:
    {
        p_os << "TextureType::NORMAL";
        break;
    };
    case TextureType::SPECULAR:
    {
        p_os << "TextureType::SPECULAR";
        break;
    };
    default:
    {
        UNHANDLED_SWITCH_CASE(__LINE__, __FILE__);
    };
    };
    return p_os;
}